

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_flatten_dot(sexp ctx,sexp ls)

{
  sexp psVar1;
  sexp unaff_retaddr;
  sexp in_stack_00000018;
  
  sexp_reverse_flatten_dot(ctx,ls);
  psVar1 = sexp_nreverse_op(in_stack_00000018,ctx,(sexp_sint_t)ls,unaff_retaddr);
  return psVar1;
}

Assistant:

static sexp sexp_flatten_dot (sexp ctx, sexp ls) {
  return sexp_nreverse(ctx, sexp_reverse_flatten_dot(ctx, ls));
}